

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whitelist_impl.h
# Opt level: O0

int secp256k1_whitelist_compute_tweaked_privkey
              (secp256k1_context *ctx,secp256k1_scalar *skey,uchar *online_key,uchar *summed_key)

{
  int iVar1;
  undefined1 local_f0 [8];
  secp256k1_scalar sonline;
  secp256k1_gej pkeyj;
  int overflow;
  int ret;
  secp256k1_scalar tweak;
  uchar *summed_key_local;
  uchar *online_key_local;
  secp256k1_scalar *skey_local;
  secp256k1_context *ctx_local;
  
  pkeyj._124_4_ = 1;
  pkeyj.infinity = 0;
  tweak.d[3] = (uint64_t)summed_key;
  secp256k1_scalar_set_b32(skey,summed_key,&pkeyj.infinity);
  if (pkeyj.infinity == 0) {
    iVar1 = secp256k1_scalar_is_zero(skey);
    if (iVar1 != 0) goto LAB_001334fe;
  }
  else {
LAB_001334fe:
    pkeyj._124_4_ = 0;
  }
  if (pkeyj._124_4_ != 0) {
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)(sonline.d + 3),skey);
    pkeyj._124_4_ =
         secp256k1_whitelist_hash_pubkey
                   ((secp256k1_scalar *)&overflow,(secp256k1_gej *)(sonline.d + 3));
  }
  if (pkeyj._124_4_ == 0) goto LAB_001335a8;
  secp256k1_scalar_mul(skey,skey,(secp256k1_scalar *)&overflow);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_f0,online_key,&pkeyj.infinity);
  if (pkeyj.infinity == 0) {
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)local_f0);
    if (iVar1 != 0) goto LAB_00133578;
  }
  else {
LAB_00133578:
    pkeyj._124_4_ = 0;
  }
  secp256k1_scalar_add(skey,skey,(secp256k1_scalar *)local_f0);
  secp256k1_scalar_clear((secp256k1_scalar *)local_f0);
  secp256k1_scalar_clear((secp256k1_scalar *)&overflow);
LAB_001335a8:
  if (pkeyj._124_4_ == 0) {
    secp256k1_scalar_clear(skey);
  }
  return pkeyj._124_4_;
}

Assistant:

static int secp256k1_whitelist_compute_tweaked_privkey(const secp256k1_context* ctx, secp256k1_scalar* skey, const unsigned char *online_key, const unsigned char *summed_key) {
    secp256k1_scalar tweak;
    int ret = 1;
    int overflow = 0;

    secp256k1_scalar_set_b32(skey, summed_key, &overflow);
    if (overflow || secp256k1_scalar_is_zero(skey)) {
        ret = 0;
    }
    if (ret) {
        secp256k1_gej pkeyj;
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &pkeyj, skey);
        ret = secp256k1_whitelist_hash_pubkey(&tweak, &pkeyj);
    }
    if (ret) {
        secp256k1_scalar sonline;
        secp256k1_scalar_mul(skey, skey, &tweak);

        secp256k1_scalar_set_b32(&sonline, online_key, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&sonline)) {
            ret = 0;
        }
        secp256k1_scalar_add(skey, skey, &sonline);
        secp256k1_scalar_clear(&sonline);
        secp256k1_scalar_clear(&tweak);
    }

    if (!ret) {
        secp256k1_scalar_clear(skey);
    }
    return ret;
}